

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addImportTableSupport(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  char *pcVar2;
  long lVar3;
  Name NVar4;
  Signature SVar5;
  string_view sVar6;
  Name local_b8;
  Name local_a8;
  string_view local_98;
  string_view local_88;
  undefined1 local_74 [4];
  Signature local_70;
  Type local_60;
  Name local_58;
  undefined1 local_48;
  Name local_40;
  __single_object func;
  
  if ((this->funcrefTableName).super_IString.str._M_str != (char *)0x0) {
    pMVar1 = this->wasm;
    Name::Name(&local_b8,"table");
    NVar4.super_IString.str._M_str = (char *)local_b8.super_IString.str._M_len;
    NVar4.super_IString.str._M_len = (size_t)pMVar1;
    lVar3 = ::wasm::Module::getExportOrNull(NVar4);
    if ((lVar3 == 0) && (this->preserveImportsAndExports == false)) {
      pMVar1 = this->wasm;
      Name::Name(&local_a8,"table");
      local_58.super_IString.str._M_len = (this->funcrefTableName).super_IString.str._M_len;
      local_58.super_IString.str._M_str = (this->funcrefTableName).super_IString.str._M_str;
      local_48 = 0;
      local_40.super_IString.str._M_str = (char *)local_a8.super_IString.str._M_len;
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           local_a8.super_IString.str._M_str;
      local_74 = (undefined1  [4])0x1;
      std::
      make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                (&local_40,(ExternalKind *)&local_40.super_IString.str._M_str,
                 (variant<wasm::Name,_wasm::HeapType> *)local_74);
      ::wasm::Module::addExport((unique_ptr *)pMVar1);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_40);
      pMVar1 = this->wasm;
      Name::Name((Name *)&local_98,"table-get");
      sVar6 = (string_view)Names::getValidFunctionName(pMVar1,(Name)local_98);
      (this->tableGetImportName).super_IString.str = sVar6;
      std::make_unique<wasm::Function>();
      pcVar2 = (this->tableGetImportName).super_IString.str._M_str;
      *(size_t *)local_40.super_IString.str._M_str =
           (this->tableGetImportName).super_IString.str._M_len;
      *(char **)((long)local_40.super_IString.str._M_str + 8) = pcVar2;
      Name::Name(&local_58,"fuzzing-support");
      *(size_t *)((long)local_40.super_IString.str._M_str + 0x18) =
           local_58.super_IString.str._M_len;
      *(char **)((long)local_40.super_IString.str._M_str + 0x20) = local_58.super_IString.str._M_str
      ;
      Name::Name(&local_58,"table-get");
      *(undefined4 *)((long)local_40.super_IString.str._M_str + 0x28) =
           (undefined4)local_58.super_IString.str._M_len;
      *(undefined4 *)((long)local_40.super_IString.str._M_str + 0x2c) =
           local_58.super_IString.str._M_len._4_4_;
      *(undefined4 *)((long)local_40.super_IString.str._M_str + 0x30) =
           local_58.super_IString.str._M_str._0_4_;
      *(undefined4 *)((long)local_40.super_IString.str._M_str + 0x34) =
           local_58.super_IString.str._M_str._4_4_;
      local_40.super_IString.str._M_len = 2;
      ::wasm::Type::Type(&local_70.params,&local_40,1);
      Type::Type(&local_70.results,(HeapType)0x10,Nullable,Inexact);
      ::wasm::HeapType::HeapType((HeapType *)&local_58,local_70);
      *(size_t *)((long)local_40.super_IString.str._M_str + 0x38) =
           local_58.super_IString.str._M_len;
      ::wasm::Module::addFunction((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 &local_40.super_IString.str._M_str);
      pMVar1 = this->wasm;
      Name::Name((Name *)&local_88,"table-set");
      sVar6 = (string_view)Names::getValidFunctionName(pMVar1,(Name)local_88);
      (this->tableSetImportName).super_IString.str = sVar6;
      std::make_unique<wasm::Function>();
      pcVar2 = (this->tableSetImportName).super_IString.str._M_str;
      *(size_t *)local_40.super_IString.str._M_str =
           (this->tableSetImportName).super_IString.str._M_len;
      *(char **)((long)local_40.super_IString.str._M_str + 8) = pcVar2;
      Name::Name(&local_58,"fuzzing-support");
      *(size_t *)((long)local_40.super_IString.str._M_str + 0x18) =
           local_58.super_IString.str._M_len;
      *(char **)((long)local_40.super_IString.str._M_str + 0x20) = local_58.super_IString.str._M_str
      ;
      Name::Name(&local_58,"table-set");
      *(size_t *)((long)local_40.super_IString.str._M_str + 0x28) =
           local_58.super_IString.str._M_len;
      *(char **)((long)local_40.super_IString.str._M_str + 0x30) = local_58.super_IString.str._M_str
      ;
      local_58.super_IString.str._M_len = 2;
      Type::Type((Type *)&local_58.super_IString.str._M_str,(HeapType)0x10,Nullable,Inexact);
      ::wasm::Type::Type(&local_60,&local_58,2);
      SVar5.results.id = 0;
      SVar5.params.id = local_60.id;
      ::wasm::HeapType::HeapType((HeapType *)&local_40,SVar5);
      *(size_t *)((long)local_40.super_IString.str._M_str + 0x38) =
           local_40.super_IString.str._M_len;
      ::wasm::Module::addFunction((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 &local_40.super_IString.str._M_str);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportTableSupport() {
  // For the table imports to be able to do anything, we must export a table
  // for them. For simplicity, use the funcref table we use internally, though
  // we could pick one at random, support non-funcref ones, and even export
  // multiple ones TODO
  if (!funcrefTableName) {
    return;
  }

  // If a "table" export already exists, skip fuzzing these imports, as the
  // current export may not contain a valid table for it. We also skip if we are
  // not adding imports or exports.
  if (wasm.getExportOrNull("table") || preserveImportsAndExports) {
    return;
  }

  // Export the table.
  wasm.addExport(
    builder.makeExport("table", funcrefTableName, ExternalKind::Table));

  // Get from the table.
  {
    tableGetImportName = Names::getValidFunctionName(wasm, "table-get");
    auto func = std::make_unique<Function>();
    func->name = tableGetImportName;
    func->module = "fuzzing-support";
    func->base = "table-get";
    func->type = Signature({Type::i32}, Type(HeapType::func, Nullable));
    wasm.addFunction(std::move(func));
  }

  // Set into the table.
  {
    tableSetImportName = Names::getValidFunctionName(wasm, "table-set");
    auto func = std::make_unique<Function>();
    func->name = tableSetImportName;
    func->module = "fuzzing-support";
    func->base = "table-set";
    func->type =
      Signature({Type::i32, Type(HeapType::func, Nullable)}, Type::none);
    wasm.addFunction(std::move(func));
  }
}